

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall dtc::fdt::property_value::write_as_string(property_value *this,FILE *file)

{
  byte bVar1;
  ulong in_RAX;
  iterator __begin3;
  byte *pbVar2;
  iterator __end3;
  byte *pbVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  putc(0x22,(FILE *)file);
  pbVar2 = (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    fputs((this->string_data)._M_dataplus._M_p,(FILE *)file);
  }
  else {
    bVar1 = pbVar3[-1];
    if (bVar1 == 0) {
      pbVar3 = pbVar3 + -1;
      (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar3;
    }
    for (; pbVar2 != pbVar3; pbVar2 = pbVar2 + 1) {
      if (*pbVar2 == 0) {
        fputs("\", \"",(FILE *)file);
      }
      else {
        putc((uint)*pbVar2,(FILE *)file);
      }
    }
    if (bVar1 == 0) {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->byte_data,(uchar *)((long)&uStack_38 + 7));
    }
  }
  putc(0x22,(FILE *)file);
  return;
}

Assistant:

void
property_value::write_as_string(FILE *file)
{
	putc('"', file);
	if (byte_data.empty())
	{
		fputs(string_data.c_str(), file);
	}
	else
	{
		bool hasNull = (byte_data.back() == '\0');
		// Remove trailing null bytes from the string before printing as dts.
		if (hasNull)
		{
			byte_data.pop_back();
		}
		for (auto i : byte_data)
		{
			// FIXME Escape tabs, newlines, and so on.
			if (i == '\0')
			{
				fputs("\", \"", file);
				continue;
			}
			putc(i, file);
		}
		if (hasNull)
		{
			byte_data.push_back('\0');
		}
	}
	putc('"', file);
}